

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

bool __thiscall
ON_wString::EqualOrdinal(ON_wString *this,ON_wString *other_string,bool bOrdinalIgnoreCase)

{
  int element_count1;
  int iVar1;
  wchar_t *string1;
  wchar_t *string2;
  undefined1 local_21;
  int length;
  bool bOrdinalIgnoreCase_local;
  ON_wString *other_string_local;
  ON_wString *this_local;
  
  element_count1 = Length(this);
  iVar1 = Length(other_string);
  local_21 = false;
  if (element_count1 == iVar1) {
    string1 = operator_cast_to_wchar_t_(this);
    string2 = operator_cast_to_wchar_t_(other_string);
    local_21 = EqualOrdinal(string1,element_count1,string2,element_count1,bOrdinalIgnoreCase);
  }
  return local_21;
}

Assistant:

bool ON_wString::EqualOrdinal(
  const ON_wString& other_string,
  bool bOrdinalIgnoreCase
  ) const
{
  const int length = Length();
  return
    (length == other_string.Length())
    && ON_wString::EqualOrdinal(
    static_cast< const wchar_t* >(*this),
    length,
    static_cast< const wchar_t* >(other_string),
    length,
    bOrdinalIgnoreCase
    );
}